

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O0

void duckdb_brotli::BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  int iVar1;
  void *pvVar2;
  HistogramDistance *pHVar3;
  void *__s;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t *__s_00;
  brotli_alloc_func p_Var6;
  brotli_alloc_func __s_01;
  brotli_free_func p_Var7;
  MemoryManager *in_RCX;
  ContextType *in_RDX;
  HistogramLiteral *in_RSI;
  HistogramCommand *in_RDI;
  size_t in_R8;
  undefined1 in_R9B;
  Command *in_stack_00000010;
  size_t in_stack_00000018;
  undefined4 in_stack_00000020;
  MemoryManager *in_stack_00000028;
  size_t j;
  double dist_cost_1;
  double dist_cost;
  int skip;
  uint32_t ndirect;
  HistogramDistance *tmp;
  BrotliDistanceParams new_params;
  BrotliDistanceParams orig_params;
  double best_dist_cost;
  int check_orig;
  uint32_t ndirect_msb;
  uint32_t npostfix;
  size_t literal_context_multiplier;
  size_t i;
  size_t distance_histograms_size;
  size_t literal_histograms_size;
  ContextType *literal_context_modes;
  HistogramLiteral *literal_histograms;
  HistogramDistance *distance_histograms;
  size_t i_1;
  size_t i_2;
  size_t i_3;
  void *in_stack_fffffffffffffe18;
  MemoryManager *in_stack_fffffffffffffe20;
  MemoryManager *m_00;
  HistogramDistance *in_stack_fffffffffffffe50;
  double *in_stack_fffffffffffffe58;
  BrotliDistanceParams *in_stack_fffffffffffffe60;
  BrotliDistanceParams *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  Command *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  uint8_t *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  Command *in_stack_fffffffffffffea0;
  MemoryManager *in_stack_fffffffffffffea8;
  uint8_t *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  BrotliEncoderParams *params_00;
  BlockSplit *literal_split;
  BlockSplit *insert_and_copy_split;
  BlockSplit *dist_split;
  size_t *out_size;
  HistogramDistance *out;
  size_t max_histograms;
  uint8_t *in_size;
  undefined4 in_stack_ffffffffffffff00;
  int iVar8;
  uint uVar9;
  uint npostfix_00;
  long local_f0;
  brotli_alloc_func local_e8;
  uint32_t *histogram_symbols;
  undefined7 in_stack_ffffffffffffff48;
  size_t sVar10;
  HistogramDistance *copy_dist_histograms;
  ulong local_70;
  brotli_free_func local_58;
  
  local_f0 = 1;
  uVar9 = 0;
  iVar8 = 1;
  in_size = (uint8_t *)0x547d42aea2879f2e;
  out_size = *(size_t **)(in_R8 + 0x38);
  out = *(HistogramDistance **)(in_R8 + 0x40);
  max_histograms = *(size_t *)(in_R8 + 0x48);
  literal_split = *(BlockSplit **)(in_R8 + 0x38);
  insert_and_copy_split = *(BlockSplit **)(in_R8 + 0x40);
  dist_split = *(BlockSplit **)(in_R8 + 0x48);
  BrotliAllocate(in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
  npostfix_00 = 0;
  do {
    if (3 < npostfix_00) {
      if ((iVar8 != 0) &&
         (ComputeDistanceCost(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                              in_stack_fffffffffffffe58,in_stack_fffffffffffffe50),
         (double)in_stack_fffffffffffffea8 < (double)in_size)) {
        *(size_t **)(in_R8 + 0x38) = out_size;
        *(HistogramDistance **)(in_R8 + 0x40) = out;
        *(size_t *)(in_R8 + 0x48) = max_histograms;
      }
      BrotliFree(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      params_00 = (BrotliEncoderParams *)0x0;
      RecomputeDistancePrefixes
                (in_stack_00000010,in_stack_00000018,
                 (BrotliDistanceParams *)&stack0xfffffffffffffee0,
                 (BrotliDistanceParams *)(in_R8 + 0x38));
      m_00 = in_stack_00000028;
      sVar10 = in_R8;
      BrotliSplitBlock(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                       ,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                       in_stack_fffffffffffffe80,params_00,literal_split,insert_and_copy_split,
                       dist_split);
      if (*(int *)(sVar10 + 0x20) == 0) {
        local_f0 = 0x40;
        if (in_stack_00000028->alloc_func == (brotli_alloc_func)0x0) {
          pvVar2 = (void *)0x0;
        }
        else {
          pvVar2 = BrotliAllocate(m_00,in_R8);
        }
        for (local_e8 = (brotli_alloc_func)0x0; local_e8 < in_stack_00000028->alloc_func;
            local_e8 = local_e8 + 1) {
          *(undefined4 *)((long)pvVar2 + (long)local_e8 * 4) = in_stack_00000020;
        }
      }
      pHVar3 = (HistogramDistance *)((long)in_stack_00000028->alloc_func * local_f0);
      if (pHVar3 == (HistogramDistance *)0x0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = BrotliAllocate(m_00,in_R8);
      }
      for (copy_dist_histograms = (HistogramDistance *)0x0; copy_dist_histograms < pHVar3;
          copy_dist_histograms = (HistogramDistance *)((long)copy_dist_histograms->data_ + 1)) {
        __s = (void *)((long)pvVar2 + (long)copy_dist_histograms * 0x410);
        memset(__s,0,0x400);
        *(undefined8 *)((long)__s + 0x400) = 0;
        *(undefined8 *)((long)__s + 0x408) = 0x7ff0000000000000;
      }
      uVar4 = (long)in_stack_00000028[4].alloc_func << 2;
      if (uVar4 == 0) {
        puVar5 = (uint32_t *)0x0;
      }
      else {
        puVar5 = (uint32_t *)BrotliAllocate(m_00,in_R8);
      }
      histogram_symbols = puVar5;
      for (local_70 = 0; local_70 < uVar4; local_70 = local_70 + 1) {
        __s_00 = puVar5 + local_70 * 0x224;
        memset(__s_00,0,0x880);
        __s_00[0x220] = 0;
        __s_00[0x221] = 0;
        __s_00[0x222] = 0;
        __s_00[0x223] = 0x7ff00000;
      }
      in_stack_00000028[8].free_func = (brotli_free_func)in_stack_00000028[2].alloc_func;
      if (in_stack_00000028[8].free_func == (brotli_free_func)0x0) {
        p_Var6 = (brotli_alloc_func)0x0;
      }
      else {
        p_Var6 = (brotli_alloc_func)BrotliAllocate(m_00,in_R8);
      }
      in_stack_00000028[8].alloc_func = p_Var6;
      p_Var6 = in_stack_00000028[8].alloc_func;
      p_Var7 = in_stack_00000028[8].free_func;
      for (local_58 = (brotli_free_func)0x0; local_58 < p_Var7; local_58 = local_58 + 1) {
        __s_01 = p_Var6 + (long)local_58 * 0xb10;
        memset(__s_01,0,0xb00);
        *(undefined8 *)(__s_01 + 0xb00) = 0;
        *(undefined8 *)(__s_01 + 0xb08) = 0x7ff0000000000000;
      }
      BrotliBuildHistogramsWithContext
                ((Command *)dist_split,(size_t)insert_and_copy_split,literal_split,
                 (BlockSplit *)params_00,
                 (BlockSplit *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0,(size_t)histogram_symbols,
                 CONCAT17(in_R9B,in_stack_ffffffffffffff48),(uint8_t)sVar10,(uint8_t)in_RCX,in_RDX,
                 in_RSI,in_RDI,copy_dist_histograms);
      BrotliFree(in_RCX,in_RDX);
      in_stack_00000028[6].free_func = (brotli_free_func)((long)in_stack_00000028->alloc_func << 6);
      if (in_stack_00000028[6].free_func == (brotli_free_func)0x0) {
        p_Var6 = (brotli_alloc_func)0x0;
      }
      else {
        p_Var6 = (brotli_alloc_func)BrotliAllocate(in_RCX,(size_t)in_RDX);
      }
      in_stack_00000028[6].alloc_func = p_Var6;
      in_stack_00000028[7].opaque = in_stack_00000028[6].free_func;
      if (in_stack_00000028[7].opaque == (void *)0x0) {
        p_Var7 = (brotli_free_func)0x0;
      }
      else {
        p_Var7 = (brotli_free_func)BrotliAllocate(in_RCX,(size_t)in_RDX);
      }
      in_stack_00000028[7].free_func = p_Var7;
      p_Var6 = in_stack_00000028[6].alloc_func;
      BrotliClusterHistogramsLiteral
                ((MemoryManager *)CONCAT44(npostfix_00,uVar9),
                 (HistogramLiteral *)CONCAT44(iVar8,in_stack_ffffffffffffff00),(size_t)in_size,
                 max_histograms,(HistogramLiteral *)out,out_size,histogram_symbols);
      BrotliFree(in_RCX,p_Var6);
      if (*(int *)(sVar10 + 0x20) != 0) {
        local_e8 = in_stack_00000028->alloc_func;
        while (local_e8 != (brotli_alloc_func)0x0) {
          local_e8 = local_e8 + -1;
          for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
            *(undefined4 *)(in_stack_00000028[6].alloc_func + ((long)local_e8 * 0x40 + uVar4) * 4) =
                 *(undefined4 *)(in_stack_00000028[6].alloc_func + (long)local_e8 * 4);
          }
        }
      }
      in_stack_00000028[7].alloc_func =
           (brotli_alloc_func)((long)in_stack_00000028[4].alloc_func << 2);
      if (in_stack_00000028[7].alloc_func == (brotli_alloc_func)0x0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = BrotliAllocate(in_RCX,(size_t)p_Var6);
      }
      in_stack_00000028[6].opaque = pvVar2;
      in_stack_00000028[9].alloc_func = in_stack_00000028[7].alloc_func;
      if (in_stack_00000028[9].alloc_func == (brotli_alloc_func)0x0) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = BrotliAllocate(in_RCX,(size_t)p_Var6);
      }
      in_stack_00000028[8].opaque = pvVar2;
      pvVar2 = in_stack_00000028[6].opaque;
      BrotliClusterHistogramsDistance
                ((MemoryManager *)CONCAT44(npostfix_00,uVar9),
                 (HistogramDistance *)CONCAT44(iVar8,in_stack_ffffffffffffff00),(size_t)in_size,
                 max_histograms,out,out_size,histogram_symbols);
      BrotliFree(in_RCX,pvVar2);
      return;
    }
    for (; uVar9 < 0x10; uVar9 = uVar9 + 1) {
      in_stack_fffffffffffffebc = uVar9 << ((byte)npostfix_00 & 0x1f);
      BrotliInitDistanceParams
                ((BrotliDistanceParams *)&stack0xfffffffffffffec8,npostfix_00,
                 in_stack_fffffffffffffebc,*(int *)(in_R8 + 0x24));
      if ((npostfix_00 == (uint32_t)out_size) &&
         (in_stack_fffffffffffffebc == (uint32_t)((ulong)out_size >> 0x20))) {
        iVar8 = 0;
      }
      iVar1 = ComputeDistanceCost(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                  in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                                  in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      in_stack_fffffffffffffeb8 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
      if ((in_stack_fffffffffffffeb8 != 0) || ((double)in_size < (double)in_stack_fffffffffffffeb0))
      break;
      *(BlockSplit **)(in_R8 + 0x38) = literal_split;
      *(BlockSplit **)(in_R8 + 0x40) = insert_and_copy_split;
      *(BlockSplit **)(in_R8 + 0x48) = dist_split;
      in_size = in_stack_fffffffffffffeb0;
    }
    if (uVar9 != 0) {
      uVar9 = uVar9 - 1;
    }
    uVar9 = uVar9 >> 1;
    npostfix_00 = npostfix_00 + 1;
  } while( true );
}

Assistant:

void duckdb_brotli::BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliDistanceParams orig_params = params->dist;
  BrotliDistanceParams new_params = params->dist;
  HistogramDistance* tmp = BROTLI_ALLOC(m, HistogramDistance, 1);

  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tmp)) return;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect,
                               params->large_window);
      if (npostfix == orig_params.distance_postfix_bits &&
          ndirect == orig_params.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands, &orig_params, &new_params, &dist_cost, tmp);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands, &orig_params, &orig_params,
                        &dist_cost, tmp);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params;
    }
  }
  BROTLI_FREE(m, tmp);
  RecomputeDistancePrefixes(cmds, num_commands, &orig_params, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}